

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::bt_peer_connection::get_specific_peer_info(bt_peer_connection *this,peer_info *p)

{
  byte *pbVar1;
  socket_type *s;
  byte bVar2;
  sha256_hash dest;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  char *in_RCX;
  span<const_char> data;
  string_view sVar5;
  string_view s_00;
  sha256_hash b32_addr;
  hasher256 local_a8;
  vector<char,_std::allocator<char>_> local_a0 [2];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  sha256_hash local_48;
  
  if (((this->super_peer_connection).super_peer_connection_hot_members.field_0x28 & 0x10) != 0) {
    *(byte *)&(p->flags).m_val = (byte)(p->flags).m_val | 1;
  }
  iVar4 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0xc])(this);
  if ((char)iVar4 != '\0') {
    *(byte *)&(p->flags).m_val = (byte)(p->flags).m_val | 2;
  }
  if (((this->super_peer_connection).field_0x887 & 2) != 0) {
    *(byte *)&(p->flags).m_val = (byte)(p->flags).m_val | 4;
  }
  if (*(short *)&(this->super_peer_connection).field_0x885 < 0) {
    *(byte *)&(p->flags).m_val = (byte)(p->flags).m_val | 8;
  }
  if (((this->super_peer_connection).field_0x889 & 1) != 0) {
    *(byte *)&(p->flags).m_val = (byte)(p->flags).m_val | 0x10;
  }
  if (((this->super_peer_connection).field_0x885 & 8) != 0) {
    *(byte *)&(p->flags).m_val = (byte)(p->flags).m_val | 0x20;
  }
  s = &(this->super_peer_connection).m_socket;
  bVar3 = is_i2p(s);
  if (bVar3) {
    pbVar1 = (byte *)((long)&(p->flags).m_val + 2);
    *pbVar1 = *pbVar1 | 1;
    iVar4 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])(this);
    if ((torrent_peer *)CONCAT44(extraout_var,iVar4) == (torrent_peer *)0x0) {
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      v1_2::peer_info::set_i2p_destination(p,(sha256_hash)ZEXT1632(ZEXT816(0)));
    }
    else {
      sVar5 = torrent_peer::dest((torrent_peer *)CONCAT44(extraout_var,iVar4));
      s_00._M_len = sVar5._M_str;
      s_00._M_str = in_RCX;
      base64decode_i2p(local_a0,(libtorrent *)sVar5._M_len,s_00);
      data.m_len = (long)local_a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
      data.m_ptr = local_a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      lcrypto::hasher256::hasher256(&local_a8,data);
      lcrypto::hasher256::final(&local_48,&local_a8);
      lcrypto::hasher256::~hasher256(&local_a8);
      if (local_a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (char *)0x0) {
        operator_delete(local_a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      dest.m_number._M_elems[2] = local_48.m_number._M_elems[2];
      dest.m_number._M_elems[3] = local_48.m_number._M_elems[3];
      dest.m_number._M_elems[0] = local_48.m_number._M_elems[0];
      dest.m_number._M_elems[1] = local_48.m_number._M_elems[1];
      dest.m_number._M_elems[4] = local_48.m_number._M_elems[4];
      dest.m_number._M_elems[5] = local_48.m_number._M_elems[5];
      dest.m_number._M_elems[6] = local_48.m_number._M_elems[6];
      dest.m_number._M_elems[7] = local_48.m_number._M_elems[7];
      v1_2::peer_info::set_i2p_destination(p,dest);
    }
  }
  bVar3 = is_utp(s);
  if (bVar3) {
    pbVar1 = (byte *)((long)&(p->flags).m_val + 2);
    *pbVar1 = *pbVar1 | 2;
  }
  bVar3 = is_ssl(s);
  if (bVar3) {
    pbVar1 = (byte *)((long)&(p->flags).m_val + 2);
    *pbVar1 = *pbVar1 | 4;
  }
  bVar2 = (this->super_peer_connection).field_0x889;
  if ((bVar2 & 0x40) != 0) {
    (p->flags).m_val = (p->flags).m_val | (uint)(-1 < (char)bVar2) * 0x80000 + 0x80000;
  }
  if (((this->super_peer_connection).super_peer_connection_hot_members.field_0x28 & 2) == 0) {
    iVar4 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x1b])
                      (this);
    if ((char)iVar4 != '\0') {
      *(byte *)&(p->flags).m_val = (byte)(p->flags).m_val | 0x40;
    }
  }
  if (((this->super_peer_connection).super_peer_connection_hot_members.field_0x28 & 2) != 0) {
    *(byte *)&(p->flags).m_val = (byte)(p->flags).m_val | 0x80;
  }
  ::std::__cxx11::string::_M_assign((string *)p);
  (p->connection_type).m_val = '\x01';
  return;
}

Assistant:

void bt_peer_connection::get_specific_peer_info(peer_info& p) const
	{
		TORRENT_ASSERT(!associated_torrent().expired());

		if (is_interesting()) p.flags |= peer_info::interesting;
		if (is_choked()) p.flags |= peer_info::choked;
		if (is_peer_interested()) p.flags |= peer_info::remote_interested;
		if (has_peer_choked()) p.flags |= peer_info::remote_choked;
		if (support_extensions()) p.flags |= peer_info::supports_extensions;
		if (is_outgoing()) p.flags |= peer_info::local_connection;
#if TORRENT_USE_I2P
		if (is_i2p(get_socket()))
		{
			p.flags |= peer_info::i2p_socket;
			auto const* pi = peer_info_struct();
			if (pi != nullptr)
			{
				try
				{
					sha256_hash const b32_addr = hasher256(base64decode_i2p(pi->dest())).final();
					p.set_i2p_destination(b32_addr);
				}
				catch (lt::system_error const&)
				{
					p.set_i2p_destination(sha256_hash());
				}
			}
			else
			{
				p.set_i2p_destination(sha256_hash());
			}
		}
#endif
		if (is_utp(get_socket())) p.flags |= peer_info::utp_socket;
		if (is_ssl(get_socket())) p.flags |= peer_info::ssl_socket;

#if !defined TORRENT_DISABLE_ENCRYPTION
		if (m_encrypted)
		{
			p.flags |= m_rc4_encrypted
				? peer_info::rc4_encrypted
				: peer_info::plaintext_encrypted;
		}
#endif

		if (!is_connecting() && in_handshake())
			p.flags |= peer_info::handshake;
		if (is_connecting()) p.flags |= peer_info::connecting;

		p.client = m_client_version;
		p.connection_type = peer_info::standard_bittorrent;
	}